

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void av1_highbd_convolve_x_sr_avx2
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  long lVar15;
  int in_ECX;
  uint uVar16;
  uint uVar17;
  long in_RDX;
  int in_ESI;
  undefined1 *puVar18;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar20 [32];
  __m128i v;
  __m128i v_00;
  long in_stack_00000008;
  undefined4 in_stack_0000001c;
  __m256i res;
  __m256i res_odd1;
  __m256i res_even1;
  __m256i res_odd;
  __m256i res_even;
  __m256i r1;
  __m256i r0;
  __m256i row1;
  __m256i row0;
  __m256i zero;
  __m256i clip_pixel;
  __m256i round_const_bits;
  __m128i round_shift_bits;
  int bits;
  __m128i round_shift_x;
  __m256i round_const_x;
  __m256i coeffs_x [4];
  __m256i s [4];
  uint16_t *src_ptr;
  int fo_horiz;
  int j;
  int i;
  undefined4 local_8cc;
  undefined8 uStack_8b0;
  undefined1 local_8c0 [32];
  undefined8 *puStack_8a8;
  undefined1 in_stack_fffffffffffff7a0 [32];
  undefined8 uStack_750;
  undefined8 uStack_748;
  byte local_714;
  undefined1 local_6e0 [128];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 in_stack_fffffffffffff9e0 [32];
  uint16_t *in_stack_fffffffffffffa00;
  uint local_5cc;
  int local_5c8;
  ulong local_5a0;
  ulong local_580;
  ulong uStack_558;
  undefined8 local_150;
  InterpFilterParams *in_stack_fffffffffffffef8;
  undefined1 in_stack_ffffffffffffff00 [16];
  int in_stack_ffffffffffffff10;
  undefined8 uStack_e8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  InterpFilterParams *filter_params;
  
  if (*(short *)(in_stack_00000008 + 8) == 0xc) {
    av1_highbd_convolve_x_sr_ssse3
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9e0._28_4_,
               in_stack_fffffffffffff9e0._16_8_,in_stack_fffffffffffff9e0._12_4_,
               in_stack_fffffffffffff9e0._8_4_,in_stack_fffffffffffff9e0._4_4_,
               in_stack_fffffffffffffef8,in_stack_ffffffffffffff00._0_4_,
               in_stack_ffffffffffffff00._8_8_,in_stack_ffffffffffffff10);
  }
  else {
    lVar15 = in_RDI + (long)(int)((*(ushort *)(in_stack_00000008 + 8) >> 1) - 1) * -2;
    uVar16 = (1 << (*(byte *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14) & 0x1f)) >> 1;
    auVar4 = vpinsrd_avx(ZEXT416(uVar16),uVar16,1);
    auVar4 = vpinsrd_avx(auVar4,uVar16,2);
    auVar4 = vpinsrd_avx(auVar4,uVar16,3);
    auVar5 = vpinsrd_avx(ZEXT416(uVar16),uVar16,1);
    auVar5 = vpinsrd_avx(auVar5,uVar16,2);
    auVar5 = vpinsrd_avx(auVar5,uVar16,3);
    uStack_e8 = auVar5._8_8_;
    local_580 = CONCAT44(0,*(uint *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14));
    uVar17 = 7 - *(int *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14);
    local_5a0 = CONCAT44(0,uVar17);
    local_714 = (byte)uVar17;
    uVar17 = (1 << (local_714 & 0x1f)) >> 1;
    auVar21 = vpinsrd_avx(ZEXT416(uVar17),uVar17,1);
    auVar21 = vpinsrd_avx(auVar21,uVar17,2);
    auVar21 = vpinsrd_avx(auVar21,uVar17,3);
    auVar19 = vpinsrd_avx(ZEXT416(uVar17),uVar17,1);
    auVar19 = vpinsrd_avx(auVar19,uVar17,2);
    auVar19 = vpinsrd_avx(auVar19,uVar17,3);
    auVar19 = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar19;
    auVar21 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar21;
    if ((int)conv_params == 10) {
      local_8cc = 0x3ff;
    }
    else {
      local_8cc = 0xff;
      if ((int)conv_params == 0xc) {
        local_8cc = 0xfff;
      }
    }
    auVar6 = vpinsrw_avx(ZEXT216((ushort)local_8cc),local_8cc,1);
    auVar6 = vpinsrw_avx(auVar6,local_8cc,2);
    auVar6 = vpinsrw_avx(auVar6,local_8cc,3);
    auVar6 = vpinsrw_avx(auVar6,local_8cc,4);
    auVar6 = vpinsrw_avx(auVar6,local_8cc,5);
    auVar6 = vpinsrw_avx(auVar6,local_8cc,6);
    auVar6 = vpinsrw_avx(auVar6,local_8cc,7);
    auVar7 = vpinsrw_avx(ZEXT216((ushort)local_8cc),local_8cc,1);
    auVar7 = vpinsrw_avx(auVar7,local_8cc,2);
    auVar7 = vpinsrw_avx(auVar7,local_8cc,3);
    auVar7 = vpinsrw_avx(auVar7,local_8cc,4);
    auVar7 = vpinsrw_avx(auVar7,local_8cc,5);
    auVar7 = vpinsrw_avx(auVar7,local_8cc,6);
    auVar7 = vpinsrw_avx(auVar7,local_8cc,7);
    uStack_70 = auVar7._0_8_;
    uStack_68 = auVar7._8_8_;
    uStack_558 = SUB328(ZEXT832(0),4);
    prepare_coeffs(filter_params,local_8c0._4_4_,(__m256i *)CONCAT44(uVar17,uVar16));
    for (local_5cc = 0; (int)local_5cc < in_R8D; local_5cc = local_5cc + 8) {
      local_5c8 = 0;
      while( true ) {
        uStack_748 = auVar21._8_8_;
        uStack_750 = auVar21._0_8_;
        if (in_R9D <= local_5c8) break;
        pauVar1 = (undefined1 (*) [32])(lVar15 + (long)(int)(local_5c8 * in_ESI + local_5cc) * 2);
        pauVar2 = (undefined1 (*) [32])
                  (lVar15 + (long)(int)((local_5c8 + 1) * in_ESI + local_5cc) * 2);
        auVar9 = vperm2i128_avx2(*pauVar1,*pauVar2,0x20);
        auVar10 = vperm2i128_avx2(*pauVar1,*pauVar2,0x31);
        local_640 = vpalignr_avx2(auVar10,auVar9,4);
        vpalignr_avx2(auVar10,auVar9,8);
        auVar20 = vpalignr_avx2(auVar10,auVar9,0xc);
        puVar18 = local_6e0;
        local_660 = auVar9;
        convolve(in_stack_fffffffffffff7a0._16_8_,in_stack_fffffffffffff7a0._8_8_);
        auVar8._16_8_ = auVar5._0_8_;
        auVar8._0_16_ = auVar4;
        auVar8._24_8_ = uStack_e8;
        auVar20 = vpaddd_avx2(auVar20,auVar8);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = local_580;
        auVar8 = vpsrad_avx2(auVar20,auVar13);
        local_660 = vpalignr_avx2(auVar10,auVar9,2);
        local_640 = vpalignr_avx2(auVar10,auVar9,6);
        vpalignr_avx2(auVar10,auVar9,10);
        auVar20 = vpalignr_avx2(auVar10,auVar9,0xe);
        convolve(in_stack_fffffffffffff7a0._16_8_,in_stack_fffffffffffff7a0._8_8_);
        auVar9._16_8_ = auVar5._0_8_;
        auVar9._0_16_ = auVar4;
        auVar9._24_8_ = uStack_e8;
        auVar20 = vpaddd_avx2(auVar20,auVar9);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = local_580;
        auVar9 = vpsrad_avx2(auVar20,auVar12);
        auVar10._16_8_ = uStack_750;
        auVar10._0_16_ = auVar19;
        auVar10._24_8_ = uStack_748;
        auVar20 = vpaddd_avx2(auVar8,auVar10);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_5a0;
        auVar8 = vpsrad_avx2(auVar20,auVar11);
        auVar20._16_8_ = uStack_750;
        auVar20._0_16_ = auVar19;
        auVar20._24_8_ = uStack_748;
        auVar20 = vpaddd_avx2(auVar9,auVar20);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_5a0;
        in_stack_fffffffffffff7a0 = vpsrad_avx2(auVar20,auVar7);
        auVar20 = vpackssdw_avx2(auVar8,auVar8);
        auVar8 = vpackssdw_avx2(in_stack_fffffffffffff7a0,in_stack_fffffffffffff7a0);
        auVar20 = vpunpcklwd_avx2(auVar20,auVar8);
        auVar14._16_8_ = uStack_70;
        auVar14._0_16_ = auVar6;
        auVar14._24_8_ = uStack_68;
        auVar20 = vpminsw_avx2(auVar20,auVar14);
        auVar20 = vpmaxsw_avx2(auVar20,ZEXT832(uStack_558) << 0x40);
        uStack_8b0 = auVar20._16_8_;
        puStack_8a8 = auVar20._24_8_;
        filter_params = auVar20._8_8_;
        if ((int)(in_R8D - local_5cc) < 5) {
          if (in_R8D == 4) {
            *(long *)(in_RDX + (long)(int)(local_5c8 * in_ECX + local_5cc) * 2) = auVar20._0_8_;
            *puStack_8a8 = local_150;
          }
          else {
            v[1]._0_4_ = local_5cc;
            v[0] = (longlong)puVar18;
            v[1]._4_4_ = 0;
            xx_storel_32((void *)(in_RDX + (long)(int)(local_5c8 * in_ECX + local_5cc) * 2),v);
            v_00[0] = (ulong)local_5cc;
            v_00[1]._0_4_ = in_ECX;
            v_00[1]._4_4_ = 0;
            xx_storel_32((void *)(in_RDX + (long)(int)(local_5c8 * in_ECX + local_5cc + in_ECX) * 2)
                         ,v_00);
          }
        }
        else {
          puVar3 = (undefined8 *)(in_RDX + (long)(int)(local_5c8 * in_ECX + local_5cc) * 2);
          *puVar3 = auVar20._0_8_;
          puVar3[1] = filter_params;
          puVar3 = (undefined8 *)(in_RDX + (long)(int)(local_5c8 * in_ECX + local_5cc + in_ECX) * 2)
          ;
          *puVar3 = uStack_8b0;
          puVar3[1] = puStack_8a8;
        }
        local_5c8 = local_5c8 + 2;
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_convolve_x_sr_avx2(const uint16_t *src, int src_stride,
                                   uint16_t *dst, int dst_stride, int w, int h,
                                   const InterpFilterParams *filter_params_x,
                                   const int subpel_x_qn,
                                   ConvolveParams *conv_params, int bd) {
  if (filter_params_x->taps == 12) {
    av1_highbd_convolve_x_sr_ssse3(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_x, subpel_x_qn, conv_params,
                                   bd);
    return;
  }
  int i, j;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_horiz;

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  __m256i s[4], coeffs_x[4];

  const __m256i round_const_x =
      _mm256_set1_epi32(((1 << conv_params->round_0) >> 1));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);

  const int bits = FILTER_BITS - conv_params->round_0;
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  assert(bits >= 0);
  assert((FILTER_BITS - conv_params->round_1) >= 0 ||
         ((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS));

  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    for (i = 0; i < h; i += 2) {
      const __m256i row0 =
          _mm256_loadu_si256((__m256i *)&src_ptr[i * src_stride + j]);
      __m256i row1 =
          _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_stride + j]);

      const __m256i r0 = _mm256_permute2x128_si256(row0, row1, 0x20);
      const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

      // even pixels
      s[0] = _mm256_alignr_epi8(r1, r0, 0);
      s[1] = _mm256_alignr_epi8(r1, r0, 4);
      s[2] = _mm256_alignr_epi8(r1, r0, 8);
      s[3] = _mm256_alignr_epi8(r1, r0, 12);

      __m256i res_even = convolve(s, coeffs_x);
      res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_x),
                                  round_shift_x);

      // odd pixels
      s[0] = _mm256_alignr_epi8(r1, r0, 2);
      s[1] = _mm256_alignr_epi8(r1, r0, 6);
      s[2] = _mm256_alignr_epi8(r1, r0, 10);
      s[3] = _mm256_alignr_epi8(r1, r0, 14);

      __m256i res_odd = convolve(s, coeffs_x);
      res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_x),
                                 round_shift_x);

      res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_bits),
                                  round_shift_bits);
      res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_bits),
                                 round_shift_bits);

      __m256i res_even1 = _mm256_packs_epi32(res_even, res_even);
      __m256i res_odd1 = _mm256_packs_epi32(res_odd, res_odd);

      __m256i res = _mm256_unpacklo_epi16(res_even1, res_odd1);
      res = _mm256_min_epi16(res, clip_pixel);
      res = _mm256_max_epi16(res, zero);

      if (w - j > 4) {
        _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j],
                         _mm256_castsi256_si128(res));
        _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                         _mm256_extracti128_si256(res, 1));
      } else if (w == 4) {
        _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j],
                         _mm256_castsi256_si128(res));
        _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                         _mm256_extracti128_si256(res, 1));
      } else {
        xx_storel_32(&dst[i * dst_stride + j], _mm256_castsi256_si128(res));
        xx_storel_32(&dst[i * dst_stride + j + dst_stride],
                     _mm256_extracti128_si256(res, 1));
      }
    }
  }
}